

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fstack.cpp
# Opt level: O0

bool fstk_FindFile(char *path,char **fullPath,size_t *size)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  int *piVar4;
  char *local_48;
  int len;
  char *incPath;
  size_t i;
  size_t *size_local;
  char **fullPath_local;
  char *path_local;
  
  if (*size == 0) {
    *size = 0x40;
    pcVar3 = (char *)realloc(*fullPath,*size);
    *fullPath = pcVar3;
    if (*fullPath == (char *)0x0) {
      piVar4 = __errno_location();
      pcVar3 = strerror(*piVar4);
      error("realloc error during include path search: %s\n",pcVar3);
    }
  }
  if (*fullPath != (char *)0x0) {
    for (incPath = (char *)0x0; incPath <= (char *)(ulong)nbIncPaths; incPath = incPath + 1) {
      if (incPath == (char *)0x0) {
        local_48 = "";
      }
      else {
        local_48 = includePaths[(long)(incPath + -1)];
      }
      iVar2 = snprintf(*fullPath,*size,"%s%s",local_48,path);
      if (iVar2 < 0) {
        piVar4 = __errno_location();
        pcVar3 = strerror(*piVar4);
        error("snprintf error during include path search: %s\n",pcVar3);
        break;
      }
      if (*size <= (ulong)(long)iVar2) {
        *size = (long)(iVar2 + 1);
        pcVar3 = (char *)realloc(*fullPath,*size);
        *fullPath = pcVar3;
        if (*fullPath == (char *)0x0) {
          piVar4 = __errno_location();
          pcVar3 = strerror(*piVar4);
          error("realloc error during include path search: %s\n",pcVar3);
          break;
        }
        iVar2 = sprintf(*fullPath,"%s%s",local_48,path);
        if (iVar2 < 0) {
          piVar4 = __errno_location();
          pcVar3 = strerror(*piVar4);
          error("sprintf error during include path search: %s\n",pcVar3);
          break;
        }
      }
      bVar1 = isPathValid(*fullPath);
      if (bVar1) {
        printDep(*fullPath);
        return true;
      }
    }
  }
  piVar4 = __errno_location();
  *piVar4 = 2;
  if ((generatedMissingIncludes & 1U) != 0) {
    printDep(path);
  }
  return false;
}

Assistant:

bool fstk_FindFile(char const *path, char **fullPath, size_t *size)
{
	if (!*size) {
		*size = 64; // This is arbitrary, really
		*fullPath = (char *)realloc(*fullPath, *size);
		if (!*fullPath)
			error("realloc error during include path search: %s\n",
			      strerror(errno));
	}

	if (*fullPath) {
		for (size_t i = 0; i <= nbIncPaths; ++i) {
			char const *incPath = i ? includePaths[i - 1] : "";
			int len = snprintf(*fullPath, *size, "%s%s", incPath, path);

			if (len < 0) {
				error("snprintf error during include path search: %s\n",
				      strerror(errno));
				break;
			}

			// Oh how I wish `asnprintf` was standard...
			if ((size_t)len >= *size) { // `size` includes the terminator, `len` doesn't
				*size = len + 1;
				*fullPath = (char *)realloc(*fullPath, *size);
				if (!*fullPath) {
					error("realloc error during include path search: %s\n",
					      strerror(errno));
					break;
				}
				len = sprintf(*fullPath, "%s%s", incPath, path);
				if (len < 0) {
					error("sprintf error during include path search: %s\n",
					       strerror(errno));
					break;
				}
			}

			if (isPathValid(*fullPath)) {
				printDep(*fullPath);
				return true;
			}
		}
	}

	errno = ENOENT;
	if (generatedMissingIncludes)
		printDep(path);
	return false;
}